

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O0

value * helics::fileops::loadToml(string *tomlString)

{
  byte bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  value *in_RDI;
  exception *se;
  ifstream file;
  invalid_argument *anon_var_0;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffd68;
  value *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_268;
  allocator<char> local_251 [33];
  allocator<char> local_230 [360];
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff70;
  istream *in_stack_ffffffffffffff78;
  spec in_stack_ffffffffffffff90;
  
  this = in_RDI;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  if (sVar2 < 0x81) {
    __a = local_230;
    std::ifstream::ifstream(__a,(string *)in_RSI,_S_bin);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      loadTomlStr(in_stack_ffffffffffffff38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)CONCAT17(bVar1,in_stack_fffffffffffffd68),__a);
      toml::spec::default_version();
      toml::parse<toml::type_config>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff90);
      std::__cxx11::string::~string(pbStack_268);
      std::allocator<char>::~allocator(local_251);
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    loadTomlStr(in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

toml::value loadToml(const std::string& tomlString)
{
    if (tomlString.size() > 128) {
        try {
            return loadTomlStr(tomlString);
        }
        catch (const std::invalid_argument&) {
            ;  // just pass through this was an assumption
        }
    }
    std::ifstream file(tomlString, std::ios_base::binary);

    try {
        if (file.is_open()) {
            return toml::parse(file);
        }
        return loadTomlStr(tomlString);
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}